

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ScopedElement * __thiscall
Catch::XmlWriter::ScopedElement::operator=(ScopedElement *this,ScopedElement *other)

{
  XmlWriter *this_00;
  XmlFormatting fmt;
  ScopedElement *other_local;
  ScopedElement *this_local;
  
  if (this->m_writer != (XmlWriter *)0x0) {
    this_00 = this->m_writer;
    fmt = operator|(Newline,Indent);
    endElement(this_00,fmt);
  }
  this->m_writer = other->m_writer;
  other->m_writer = (XmlWriter *)0x0;
  this->m_fmt = other->m_fmt;
  other->m_fmt = None;
  return this;
}

Assistant:

XmlWriter::ScopedElement &XmlWriter::ScopedElement::operator=(ScopedElement &&other) noexcept {
    if (m_writer) {
      m_writer->endElement();
    }
    m_writer = other.m_writer;
    other.m_writer = nullptr;
    m_fmt = other.m_fmt;
    other.m_fmt = XmlFormatting::None;
    return *this;
  }